

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O1

_Bool test_next_bits_iterate(void)

{
  uint64_t *puVar1;
  long lVar2;
  bool bVar3;
  _Bool _Var4;
  bitset_t *pbVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint64_t uVar10;
  int i;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  size_t buffer [3];
  ulong local_38 [4];
  
  uVar11 = 0;
  pbVar5 = bitset_create();
  do {
    uVar13 = uVar11 >> 6;
    if (uVar13 < pbVar5->arraysize) {
LAB_001025ab:
      pbVar5->array[uVar13] = pbVar5->array[uVar13] | 1L << ((byte)uVar11 & 0x3f);
    }
    else {
      _Var4 = bitset_grow(pbVar5,uVar13 + 1);
      if (_Var4) goto LAB_001025ab;
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 100);
  uVar11 = 0x3e6;
  do {
    uVar11 = uVar11 + 2;
    uVar13 = uVar11 >> 6;
    if (uVar13 < pbVar5->arraysize) {
LAB_001025ed:
      pbVar5->array[uVar13] = pbVar5->array[uVar13] | 1L << ((byte)uVar11 & 0x3e);
    }
    else {
      _Var4 = bitset_grow(pbVar5,uVar13 + 1);
      if (_Var4) goto LAB_001025ed;
    }
  } while (uVar11 < 0x44a);
  uVar11 = pbVar5->arraysize;
  uVar13 = 0;
  lVar8 = 0;
LAB_0010261a:
  uVar7 = uVar13 >> 6;
  if (uVar7 < uVar11) {
    puVar1 = pbVar5->array;
    uVar10 = (puVar1[uVar7] >> ((byte)uVar13 & 0x3f)) << ((byte)uVar13 & 0x3f);
    uVar9 = uVar13 & 0xffffffffffffffc0;
    uVar6 = 0;
    do {
      while (uVar10 == 0) {
        uVar7 = uVar7 + 1;
        if (uVar7 == uVar11) goto LAB_0010268b;
        uVar9 = uVar9 + 0x40;
        uVar10 = puVar1[uVar7];
        if (2 < uVar6) goto LAB_0010268b;
      }
      uVar12 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
        }
      }
      local_38[uVar6] = uVar12 | uVar9;
      uVar12 = uVar10 - 1;
      if (uVar6 == 2) {
        uVar12 = 0xffffffffffffffff;
      }
      uVar6 = uVar6 + 1;
      uVar10 = uVar10 & uVar12;
    } while (uVar6 != 3);
    uVar6 = 3;
LAB_0010268b:
    if (uVar6 != 0) {
      uVar13 = local_38[uVar6 - 1];
    }
  }
  else {
    uVar6 = 0;
  }
  if (uVar6 != 0) {
    uVar7 = lVar8 * 2 + 800;
    uVar9 = 0;
    do {
      uVar12 = lVar8 + uVar9;
      if (99 < lVar8 + uVar9) {
        uVar12 = uVar7;
      }
      if (local_38[uVar9] != uVar12) {
        test_next_bits_iterate_cold_1();
        goto LAB_001026f4;
      }
      uVar9 = uVar9 + 1;
      uVar7 = uVar7 + 2;
    } while (uVar6 != uVar9);
    uVar13 = uVar13 + 1;
    lVar8 = uVar6 + lVar8;
    goto LAB_0010261a;
  }
  if (lVar8 == 0x96) {
    bitset_free(pbVar5);
    return true;
  }
LAB_001026f4:
  test_next_bits_iterate_cold_2();
  uVar11 = 0;
  pbVar5 = bitset_create();
  do {
    uVar13 = uVar11 >> 6;
    if ((uVar13 < pbVar5->arraysize) || (_Var4 = bitset_grow(pbVar5,uVar13 + 1), _Var4)) {
      pbVar5->array[uVar13] = pbVar5->array[uVar13] | 1L << ((byte)uVar11 & 0x3f);
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 100);
  uVar11 = 0x3e6;
  do {
    uVar11 = uVar11 + 2;
    uVar13 = uVar11 >> 6;
    if ((uVar13 < pbVar5->arraysize) || (_Var4 = bitset_grow(pbVar5,uVar13 + 1), _Var4)) {
      pbVar5->array[uVar13] = pbVar5->array[uVar13] | 1L << ((byte)uVar11 & 0x3e);
    }
  } while (uVar11 < 0x44a);
  uVar11 = 0;
  uVar13 = 0;
  do {
    uVar7 = uVar11 >> 6;
    if (uVar7 < pbVar5->arraysize) {
      uVar6 = pbVar5->array[uVar7] >> ((byte)uVar11 & 0x3f);
      if (uVar6 == 0) {
        lVar8 = uVar7 * -0x40;
        do {
          uVar7 = uVar7 + 1;
          if (pbVar5->arraysize == uVar7) goto LAB_001027e0;
          uVar6 = pbVar5->array[uVar7];
          lVar8 = lVar8 + -0x40;
        } while (uVar6 == 0);
        lVar2 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar11 = lVar2 - lVar8;
      }
      else {
        lVar8 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        uVar11 = uVar11 + lVar8;
      }
      bVar3 = true;
    }
    else {
LAB_001027e0:
      bVar3 = false;
    }
    if (!bVar3) {
      if (uVar13 == 0x96) {
        bitset_free(pbVar5);
        return true;
      }
      goto LAB_00102822;
    }
    uVar7 = uVar13 * 2 + 800;
    if (uVar13 < 100) {
      uVar7 = uVar13;
    }
    if (uVar11 != uVar7) {
      test_next_bit_iterate_cold_2();
LAB_00102822:
      test_next_bit_iterate_cold_1();
      test_next_bit_iterate();
      test_next_bits_iterate();
      test_set_to_val();
      test_construct();
      test_union_intersection();
      test_iterate();
      test_iterate2();
      test_max_min();
      test_counts();
      test_shift_right();
      test_shift_left();
      test_disjoint();
      test_intersects();
      test_contains_all();
      test_contains_all_different_sizes();
      puts("All TEST_ASSERTs passed. Code is probably ok.");
      return false;
    }
    uVar13 = uVar13 + 1;
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

bool test_next_bits_iterate() {
  bitset_t *b = bitset_create();
  for (int i = 0; i < 100; i++)
    bitset_set(b, i);
  for (int i = 1000; i < 1100; i += 2)
    bitset_set(b, i);

  size_t buffer[3];
  size_t howmany = 0;
  size_t i = 0;
  for (size_t startfrom = 0;
       (howmany = bitset_next_set_bits(
            b, buffer, sizeof(buffer) / sizeof(buffer[0]), &startfrom)) > 0;
       startfrom++) {
    for (size_t j = 0; j < howmany; j++) {
      size_t expected;
      if (i < 100) {
        expected = i;
      } else {
        expected = 1000 + 2 * (i - 100);
      }
      TEST_ASSERT(buffer[j] == expected);
      ++i;
    }
  }
  TEST_ASSERT(i == 150);
  bitset_free(b);
  return true;
}